

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_struct<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  detail *this;
  StructBegin sb;
  FieldBegin fb;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  detail *pdVar14;
  detail *pdVar15;
  string_view tag_00;
  string_view tags;
  
  sVar5 = tag._len;
  pcVar6 = tag._ptr;
  uVar2 = 0;
  sVar7 = 0;
  pdVar14 = (detail *)0x0;
  uVar8 = sVar5 - 1;
  if (sVar5 == 0) {
    uVar8 = uVar2;
  }
  if (sVar5 != 0 && sVar5 - 1 != 0) {
    uVar3 = 0;
    do {
      uVar2 = uVar3;
      if (pcVar6[uVar3] == '`') break;
      uVar3 = uVar3 + 1;
      uVar2 = uVar8;
    } while (uVar8 != uVar3);
    uVar3 = uVar2;
    if (uVar8 < uVar2) {
      uVar3 = uVar8;
    }
    sVar7 = uVar8 - uVar3;
    if (sVar7 == 0) {
      uVar8 = full_tag._len;
      pdVar14 = (detail *)full_tag._ptr;
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
LAB_00169aa0:
        pdVar15 = pdVar14;
        uVar3 = uVar8;
        if (uVar3 != 0) {
          pdVar14 = pdVar15;
          uVar8 = uVar3;
          do {
            uVar13 = 0;
LAB_00169abc:
            uVar10 = 0xffffffffffffffff;
            if (uVar8 == uVar13) goto LAB_00169aef;
            if (pdVar14[uVar13] == *(detail *)(pcVar6 + uVar13)) goto code_r0x00169ad2;
            pdVar14 = pdVar14 + 1;
            uVar8 = uVar8 - 1;
          } while( true );
        }
      }
LAB_00169b3b:
      sVar7 = 0;
      pdVar14 = (detail *)0x0;
    }
    else {
      pdVar14 = (detail *)(pcVar6 + uVar3);
    }
  }
  goto LAB_00169b3e;
code_r0x00169ad2:
  uVar13 = uVar13 + 1;
  if (uVar2 == uVar13) {
    if (pdVar14 != pdVar15 + uVar3) {
      uVar10 = (long)pdVar14 - (long)pdVar15;
    }
LAB_00169aef:
    uVar13 = uVar10;
    if (uVar3 < uVar10) {
      uVar13 = uVar3;
    }
    uVar8 = uVar3 - uVar13;
    uVar12 = uVar2;
    if (uVar8 < uVar2) {
      uVar12 = uVar8;
    }
    uVar8 = uVar8 - uVar12;
    if (uVar8 == 0) goto LAB_00169b3b;
    if (pdVar15[uVar12 + uVar13] == (detail)0x7d) goto LAB_00169b3b;
    pdVar14 = pdVar15 + uVar12 + uVar13;
    if (pdVar15[uVar12 + uVar13] != (detail)0x60) goto LAB_00169aa0;
    if (uVar8 == 1) {
      sVar7 = 0;
      goto LAB_00169b3e;
    }
    if (uVar3 <= uVar10) {
      uVar10 = uVar3;
    }
    uVar3 = uVar3 - uVar10;
    uVar13 = uVar3;
    if (uVar2 < uVar3) {
      uVar13 = uVar2;
    }
    sVar7 = 1;
    lVar11 = 1;
    goto LAB_00169caf;
  }
  goto LAB_00169abc;
LAB_00169caf:
  do {
    if (pdVar15[sVar7 + uVar13 + uVar10] == (detail)0x7d) {
      lVar11 = lVar11 + -1;
      if (lVar11 == 0) goto LAB_00169b3e;
    }
    else if (pdVar15[sVar7 + uVar13 + uVar10] == (detail)0x7b) {
      lVar11 = lVar11 + 1;
    }
    sVar7 = sVar7 + 1;
  } while (uVar3 - uVar13 != sVar7);
  sVar7 = uVar8 - 1;
LAB_00169b3e:
  sb.name._len = uVar2 - (uVar2 != 0);
  sb.name._ptr = pcVar6 + (uVar2 != 0);
  sb.tag._ptr = (char *)pdVar14;
  sb.tag._len = sVar7;
  bVar1 = binlog::ToStringVisitor::visit(visitor,sb,istream);
  sVar5 = extraout_RDX;
  if (bVar1) {
    return;
  }
  do {
    if (sVar7 == 0) {
      binlog::ToStringVisitor::visit(visitor);
      return;
    }
    pdVar15 = pdVar14 + 1;
    uVar3 = 0;
    uVar8 = sVar7 - 1;
    uVar2 = uVar3;
    if (uVar8 != 0) {
      do {
        uVar2 = uVar3;
        if (pdVar15[uVar3] == (detail)0x27) break;
        uVar3 = uVar3 + 1;
        uVar2 = uVar8;
      } while (uVar8 != uVar3);
    }
    uVar3 = uVar2 + 1;
    if (uVar8 < uVar2 + 1) {
      uVar3 = uVar8;
    }
    this = pdVar15 + uVar3;
    pcVar9 = (char *)(uVar8 - uVar3);
    tags._len = sVar5;
    tags._ptr = pcVar9;
    pcVar4 = (char *)tag_first_size(this,tags);
    pcVar6 = pcVar4;
    if (pcVar9 < pcVar4) {
      pcVar6 = pcVar9;
    }
    pdVar14 = this + (long)pcVar6;
    fb.name._len = uVar2;
    fb.name._ptr = (char *)pdVar15;
    fb.tag._ptr = (char *)this;
    fb.tag._len = (size_t)pcVar4;
    binlog::ToStringVisitor::visit(visitor,fb);
    tag_00._len = (size_t)pcVar4;
    tag_00._ptr = (char *)this;
    visit_impl<binlog::ToStringVisitor,binlog::Range>(full_tag,tag_00,visitor,istream,max_recursion)
    ;
    binlog::ToStringVisitor::visit(visitor);
    sVar7 = (long)pcVar9 - (long)pcVar6;
    sVar5 = extraout_RDX_00;
  } while( true );
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}